

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxDomain.cpp
# Opt level: O1

void __thiscall amrex::BoxDomain::add(BoxDomain *this,Box *b)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  Box *pBVar5;
  pointer pBVar6;
  Box *pBVar7;
  long lVar8;
  pointer b_00;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> check;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> tmp;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> local_98;
  void *local_78;
  void *pvStack_70;
  long local_68;
  BoxList *local_60;
  pointer local_58;
  BoxList local_50;
  
  local_78 = (void *)0x0;
  pvStack_70 = (void *)0x0;
  local_68 = 0;
  local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (Box *)0x0;
  local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Box *)0x0;
  local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
            ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_98,(iterator)0x0,b);
  b_00 = (this->super_BoxList).m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data
         ._M_start;
  local_58 = (this->super_BoxList).m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_60 = &this->super_BoxList;
  if (b_00 != local_58) {
    do {
      pBVar6 = local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pBVar5 = local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pvStack_70 != local_78) {
        pvStack_70 = local_78;
      }
      for (; pBVar5 != pBVar6; pBVar5 = pBVar5 + 1) {
        bVar4 = Box::intersects(pBVar5,b_00);
        if (bVar4) {
          boxDiff(&local_50,pBVar5,b_00);
          std::vector<amrex::Box,std::allocator<amrex::Box>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>>
                    ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_78,pvStack_70,
                     local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          (pBVar5->smallend).vect[0] = 1;
          (pBVar5->smallend).vect[1] = 1;
          (pBVar5->smallend).vect[2] = 1;
          (pBVar5->bigend).vect[0] = 0;
          (pBVar5->bigend).vect[1] = 0;
          *(undefined8 *)((pBVar5->bigend).vect + 2) = 0;
          if (local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_50.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_50.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      lVar8 = ((long)local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7 >> 2;
      pBVar6 = local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < lVar8) {
        pBVar6 = local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar8 * 4;
        lVar8 = lVar8 + 1;
        pBVar5 = local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start + 2;
        do {
          if ((((pBVar5[-2].bigend.vect[0] < pBVar5[-2].smallend.vect[0]) ||
               (pBVar5[-2].bigend.vect[1] < pBVar5[-2].smallend.vect[1])) ||
              (pBVar5[-2].bigend.vect[2] < pBVar5[-2].smallend.vect[2])) ||
             (7 < pBVar5[-2].btype.itype)) {
            pBVar5 = pBVar5 + -2;
            goto LAB_0056e1ca;
          }
          if (((pBVar5[-1].bigend.vect[0] < pBVar5[-1].smallend.vect[0]) ||
              (pBVar5[-1].bigend.vect[1] < pBVar5[-1].smallend.vect[1])) ||
             ((pBVar5[-1].bigend.vect[2] < pBVar5[-1].smallend.vect[2] ||
              (7 < pBVar5[-1].btype.itype)))) {
            pBVar5 = pBVar5 + -1;
            goto LAB_0056e1ca;
          }
          if ((((pBVar5->bigend).vect[0] < (pBVar5->smallend).vect[0]) ||
              ((pBVar5->bigend).vect[1] < (pBVar5->smallend).vect[1])) ||
             (((pBVar5->bigend).vect[2] < (pBVar5->smallend).vect[2] || (7 < (pBVar5->btype).itype))
             )) goto LAB_0056e1ca;
          if ((((pBVar5[1].bigend.vect[0] < pBVar5[1].smallend.vect[0]) ||
               (pBVar5[1].bigend.vect[1] < pBVar5[1].smallend.vect[1])) ||
              (pBVar5[1].bigend.vect[2] < pBVar5[1].smallend.vect[2])) ||
             (7 < pBVar5[1].btype.itype)) {
            pBVar5 = pBVar5 + 1;
            goto LAB_0056e1ca;
          }
          lVar8 = lVar8 + -1;
          pBVar5 = pBVar5 + 4;
        } while (1 < lVar8);
      }
      lVar8 = ((long)local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pBVar6 >> 2) * 0x6db6db6db6db6db7;
      if (lVar8 == 1) {
LAB_0056e196:
        pBVar5 = pBVar6;
        if ((((pBVar6->smallend).vect[0] <= (pBVar6->bigend).vect[0]) &&
            ((pBVar6->smallend).vect[1] <= (pBVar6->bigend).vect[1])) &&
           (((pBVar6->smallend).vect[2] <= (pBVar6->bigend).vect[2] && ((pBVar6->btype).itype < 8)))
           ) {
          pBVar5 = local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
      }
      else if (lVar8 == 2) {
LAB_0056e175:
        pBVar5 = pBVar6;
        if (((((pBVar6->smallend).vect[0] <= (pBVar6->bigend).vect[0]) &&
             ((pBVar6->smallend).vect[1] <= (pBVar6->bigend).vect[1])) &&
            ((pBVar6->smallend).vect[2] <= (pBVar6->bigend).vect[2])) && ((pBVar6->btype).itype < 8)
           ) {
          pBVar6 = pBVar6 + 1;
          goto LAB_0056e196;
        }
      }
      else {
        pBVar5 = local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (((lVar8 == 3) &&
            (pBVar5 = pBVar6, (pBVar6->smallend).vect[0] <= (pBVar6->bigend).vect[0])) &&
           (((pBVar6->smallend).vect[1] <= (pBVar6->bigend).vect[1] &&
            (((pBVar6->smallend).vect[2] <= (pBVar6->bigend).vect[2] && ((pBVar6->btype).itype < 8))
            )))) {
          pBVar6 = pBVar6 + 1;
          goto LAB_0056e175;
        }
      }
LAB_0056e1ca:
      pBVar7 = pBVar5 + 1;
      if (pBVar7 != local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish &&
          pBVar5 != local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        do {
          if ((((pBVar7->smallend).vect[0] <= (pBVar7->bigend).vect[0]) &&
              ((pBVar7->smallend).vect[1] <= (pBVar7->bigend).vect[1])) &&
             (((pBVar7->smallend).vect[2] <= (pBVar7->bigend).vect[2] && ((pBVar7->btype).itype < 8)
              ))) {
            uVar1 = *(undefined8 *)(pBVar7->smallend).vect;
            uVar2 = *(undefined8 *)((pBVar7->smallend).vect + 2);
            uVar3 = *(undefined8 *)((pBVar7->bigend).vect + 2);
            *(undefined8 *)(pBVar5->bigend).vect = *(undefined8 *)(pBVar7->bigend).vect;
            *(undefined8 *)((pBVar5->bigend).vect + 2) = uVar3;
            *(undefined8 *)(pBVar5->smallend).vect = uVar1;
            *(undefined8 *)((pBVar5->smallend).vect + 2) = uVar2;
            pBVar5 = pBVar5 + 1;
          }
          pBVar7 = pBVar7 + 1;
        } while (pBVar7 != local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_finish);
      }
      if ((pBVar5 != local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish) &&
         (local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_finish != pBVar5)) {
        local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish = pBVar5;
      }
      std::vector<amrex::Box,std::allocator<amrex::Box>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<amrex::Box*,std::vector<amrex::Box,std::allocator<amrex::Box>>>>
                ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_98,
                 local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_78,pvStack_70);
      b_00 = b_00 + 1;
    } while (b_00 != local_58);
  }
  BoxList::join(local_60,&local_98);
  if (local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (Box *)0x0) {
    operator_delete(local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  return;
}

Assistant:

void
BoxDomain::add (const Box& b)
{
    BL_ASSERT(b.ixType() == ixType());

    Vector<Box> tmp, check;

    check.push_back(b);

    for (const auto& bx : *this)
    {
        tmp.clear();
        for (auto& cbx : check)
        {
            if (cbx.intersects(bx))
            {
                const BoxList& tmpbl = amrex::boxDiff(cbx, bx);
                tmp.insert(std::end(tmp), std::begin(tmpbl), std::end(tmpbl));
                cbx = Box();
            }
        }
        check.erase(std::remove_if(check.begin(), check.end(),
                                   [](const Box& x) { return x.isEmpty(); }),
                    check.end());
        check.insert(std::end(check), std::begin(tmp), std::end(tmp));
    }
    join(check);
    BL_ASSERT(ok());
}